

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tape.cpp
# Opt level: O0

unique_ptr<BasicTape,_std::default_delete<BasicTape>_> __thiscall
TapeGenerator::generate(TapeGenerator *this,int64_t opt)

{
  runtime_error *this_00;
  unique_ptr<StandardTape,_std::default_delete<StandardTape>_> local_40 [4];
  char local_19;
  int64_t iStack_18;
  uint8_t var;
  int64_t opt_local;
  
  local_19 = ((byte)opt & 8) + ((byte)opt & 4) * '\x02';
  iStack_18 = opt;
  opt_local = (int64_t)this;
  switch(local_19) {
  case '\0':
    std::make_unique<StandardTape,long&>((long *)local_40);
    std::unique_ptr<BasicTape,std::default_delete<BasicTape>>::
    unique_ptr<StandardTape,std::default_delete<StandardTape>,void>
              ((unique_ptr<BasicTape,std::default_delete<BasicTape>> *)this,local_40);
    std::unique_ptr<StandardTape,_std::default_delete<StandardTape>_>::~unique_ptr(local_40);
    return (__uniq_ptr_data<BasicTape,_std::default_delete<BasicTape>,_true,_true>)
           (__uniq_ptr_data<BasicTape,_std::default_delete<BasicTape>,_true,_true>)this;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Runtime Error: Unknown tape type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
}

Assistant:

std::unique_ptr<BasicTape> TapeGenerator::generate(int64_t opt) {
    using namespace wtlgo::bf;
    uint8_t var = (opt & WRAPPING_TAPE) * 2 + (opt & INFINITE_TAPE);
    switch (var) {
        case true  * 2 + true : return std::make_unique<InfiniteWrappingTape>(opt);
        case true  * 2 + false: return std::make_unique<WrappingTape>(opt);
        case false * 2 + true : return std::make_unique<InfiniteTape>(opt);
        case false * 2 + false: return std::make_unique<StandardTape>(opt);
    
        default: throw std::runtime_error("Runtime Error: Unknown tape type");
    }

    return nullptr; 
}